

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_getuservalue(lua_State *L,int idx)

{
  StkId pTVar1;
  lua_CFunction p_Var2;
  TValue *pTVar3;
  
  pTVar3 = index2addr(L,idx);
  pTVar1 = L->top;
  p_Var2 = (pTVar3->value_).f;
  pTVar1->value_ = *(Value *)(p_Var2 + 0x20);
  pTVar1->tt_ = (uint)(byte)p_Var2[10];
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  return pTVar1->tt_ & 0xf;
}

Assistant:

LUA_API int lua_getuservalue(lua_State *L, int idx) {
    StkId o;
    lua_lock(L);
    o = index2addr(L, idx);
    api_check(L, ttisfulluserdata(o), "full userdata expected");
    getuservalue(L, uvalue(o), L->top);
    api_incr_top(L);
    lua_unlock(L);
    return ttnov(L->top - 1);
}